

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optpfor.h
# Opt level: O2

string * __thiscall
FastPForLib::OPTPFor<4u,FastPForLib::Simple16<false>>::name_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  string local_1b0;
  ostringstream convert;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&convert);
  poVar1 = std::operator<<((ostream *)&convert,"OPTPFor<");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,",");
  Simple16<false>::name_abi_cxx11_(&local_1b0,(Simple16<false> *)((long)this + 8));
  poVar1 = std::operator<<(poVar1,(string *)&local_1b0);
  std::operator<<(poVar1,">");
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&convert);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string name() const {
    std::ostringstream convert;
    convert
        << "OPTPFor<" << BlockSizeInUnitsOfPackSize << ","
        << NewPFor<BlockSizeInUnitsOfPackSize, ExceptionCoder>::ecoder.name()
        << ">";
    return convert.str();
  }